

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

Command * __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::chooseCommandFromMultipleProducers
          (CAPIBuildSystemFrontendDelegate *this,Node *outputNode,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  pointer ppCVar1;
  CAPIBuildKey *this_00;
  Command *pCVar2;
  size_t in_RCX;
  StringRef path;
  llb_build_key_t *output;
  size_type sStack_60;
  string str;
  
  if ((this->cAPIDelegate).choose_command_from_multiple_producers ==
      (_func_llb_buildsystem_command_t_ptr_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t
       *)0x0) {
    pCVar2 = (Command *)0x0;
  }
  else {
    output = (llb_build_key_t *)(outputNode->name)._M_dataplus._M_p;
    sStack_60 = (outputNode->name)._M_string_length;
    llvm::StringRef::str_abi_cxx11_(&str,(StringRef *)&output);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    path.Length = in_RCX;
    path.Data = (char *)str._M_string_length;
    llbuild::buildsystem::BuildKey::makeNode
              ((BuildKey *)&output,(BuildKey *)str._M_dataplus._M_p,path);
    CAPIBuildKey::CAPIBuildKey(this_00,(BuildKey *)&output);
    std::__cxx11::string::_M_dispose();
    ppCVar1 = (commands->
              super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    output = (llb_build_key_t *)this_00;
    pCVar2 = (Command *)
             (*(this->cAPIDelegate).choose_command_from_multiple_producers)
                       ((this->cAPIDelegate).context,&output,(llb_buildsystem_command_t **)ppCVar1,
                        (long)(commands->
                              super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3);
    llb_build_key_destroy(output);
    std::__cxx11::string::_M_dispose();
  }
  return pCVar2;
}

Assistant:

virtual Command* chooseCommandFromMultipleProducers(Node* outputNode,
                   std::vector<Command*> commands) override {
    if (cAPIDelegate.choose_command_from_multiple_producers) {
      auto str = outputNode->getName().str();
      auto output = (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeNode(str));

      llb_buildsystem_command_t* command = cAPIDelegate.choose_command_from_multiple_producers(
        cAPIDelegate.context,
        &output,
        (llb_buildsystem_command_t**)commands.data(),
        commands.size()
      );

      llb_build_key_destroy(output);

      return (Command*)command;
    } else {
      return nullptr;
    }
  }